

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DockNodeHideHostWindow(ImGuiDockNode *node)

{
  undefined1 *puVar1;
  ImGuiWindow *pIVar2;
  
  pIVar2 = node->HostWindow;
  if (pIVar2 != (ImGuiWindow *)0x0) {
    if (pIVar2->DockNodeAsHost == node) {
      pIVar2->DockNodeAsHost = (ImGuiDockNode *)0x0;
    }
    node->HostWindow = (ImGuiWindow *)0x0;
  }
  if ((node->Windows).Size == 1) {
    pIVar2 = *(node->Windows).Data;
    node->VisibleWindow = pIVar2;
    puVar1 = &pIVar2->field_0x492;
    *puVar1 = *puVar1 & 0xfe;
  }
  if (node->TabBar != (ImGuiTabBar *)0x0) {
    IM_DELETE<ImGuiTabBar>(node->TabBar);
    node->TabBar = (ImGuiTabBar *)0x0;
  }
  return;
}

Assistant:

static void ImGui::DockNodeHideHostWindow(ImGuiDockNode* node)
{
    if (node->HostWindow)
    {
        if (node->HostWindow->DockNodeAsHost == node)
            node->HostWindow->DockNodeAsHost = NULL;
        node->HostWindow = NULL;
    }

    if (node->Windows.Size == 1)
    {
        node->VisibleWindow = node->Windows[0];
        node->Windows[0]->DockIsActive = false;
    }

    if (node->TabBar)
        DockNodeRemoveTabBar(node);
}